

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

JointPolicyPureVectorForClusteredBG * __thiscall
JointPolicyPureVectorForClusteredBG::operator=
          (JointPolicyPureVectorForClusteredBG *this,JointPolicyDiscrete *o)

{
  long lVar1;
  JointPolicyPureVectorForClusteredBG *pJVar2;
  undefined8 in_RSI;
  long *in_RDI;
  JointPolicyPureVectorForClusteredBG *o2;
  
  lVar1 = __dynamic_cast(in_RSI,&JointPolicyDiscrete::typeinfo,&typeinfo,0);
  if (lVar1 == 0) {
    __cxa_bad_cast();
  }
  pJVar2 = (JointPolicyPureVectorForClusteredBG *)(**(code **)(*in_RDI + 0xd0))(in_RDI,lVar1);
  return pJVar2;
}

Assistant:

JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyDiscrete& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyPureVectorForClusteredBG& JointPolicyPureVectorForClusteredBG::operator= (const JointPolicyDiscrete& o)  called" << endl;
#endif
    const JointPolicyPureVectorForClusteredBG& o2 = dynamic_cast
        <const JointPolicyPureVectorForClusteredBG& >(o);
    return(this->operator=(o2)) ;
}